

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertySpecification.cpp
# Opt level: O3

PropertyDefinition * __thiscall
Rml::PropertySpecification::RegisterProperty
          (PropertySpecification *this,String *property_name,String *default_value,bool inherited,
          bool forces_layout,PropertyId id)

{
  IdNameMap<Rml::PropertyId> *this_00;
  code *pcVar1;
  PropertyId PVar2;
  bool bVar3;
  PropertyDefinition *this_01;
  undefined3 in_register_00000089;
  pointer __p;
  uint uVar4;
  pointer puVar6;
  __uniq_ptr_impl<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_> local_38;
  ulong uVar5;
  
  uVar4 = CONCAT31(in_register_00000089,id);
  this_00 = &((this->property_map)._M_t.
              super___uniq_ptr_impl<Rml::PropertyIdNameMap,_std::default_delete<Rml::PropertyIdNameMap>_>
              ._M_t.
              super__Tuple_impl<0UL,_Rml::PropertyIdNameMap_*,_std::default_delete<Rml::PropertyIdNameMap>_>
              .super__Head_base<0UL,_Rml::PropertyIdNameMap_*,_false>._M_head_impl)->
             super_IdNameMap<Rml::PropertyId>;
  if (uVar4 == 0) {
    PVar2 = IdNameMap<Rml::PropertyId>::GetOrCreateId(this_00,property_name);
    uVar4 = (uint)PVar2;
  }
  else {
    IdNameMap<Rml::PropertyId>::AddPair(this_00,id,property_name);
  }
  PVar2 = (PropertyId)uVar4;
  if ((char)PVar2 < '\0') {
    Log::Message(LT_ERROR,
                 "Fatal error while registering property \'%s\': Maximum number of allowed properties exceeded. Continuing execution may lead to crash."
                 ,(property_name->_M_dataplus)._M_p);
    bVar3 = Assert("RMLUI_ERROR",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/PropertySpecification.cpp"
                   ,0x42);
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (this->properties).
             super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    goto LAB_0025a59f;
  }
  uVar4 = uVar4 & 0xff;
  uVar5 = (ulong)uVar4;
  puVar6 = (this->properties).
           super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (uVar5 < (ulong)((long)(this->properties).
                            super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)puVar6 >> 3)) {
    if ((_Head_base<0UL,_Rml::PropertyDefinition_*,_false>)
        *(_Tuple_impl<0UL,_Rml::PropertyDefinition_*,_std::default_delete<Rml::PropertyDefinition>_>
          *)&puVar6[uVar5]._M_t.
             super___uniq_ptr_impl<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>
        == (PropertyDefinition *)0x0) goto LAB_0025a521;
    Log::Message(LT_ERROR,"While registering property \'%s\': The property is already registered.",
                 (property_name->_M_dataplus)._M_p);
  }
  else {
    ::std::
    vector<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
    ::resize(&this->properties,uVar5 + (uVar4 >> 1) + 1);
LAB_0025a521:
    this_01 = (PropertyDefinition *)operator_new(0x80);
    PropertyDefinition::PropertyDefinition(this_01,PVar2,default_value,inherited,forces_layout);
    local_38._M_t.
    super__Tuple_impl<0UL,_Rml::PropertyDefinition_*,_std::default_delete<Rml::PropertyDefinition>_>
    .super__Head_base<0UL,_Rml::PropertyDefinition_*,_false>._M_head_impl =
         (tuple<Rml::PropertyDefinition_*,_std::default_delete<Rml::PropertyDefinition>_>)
         (_Tuple_impl<0UL,_Rml::PropertyDefinition_*,_std::default_delete<Rml::PropertyDefinition>_>
         )0x0;
    ::std::__uniq_ptr_impl<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>::
    reset((__uniq_ptr_impl<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_> *
          )((long)&(((this->properties).
                     super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                   super___uniq_ptr_impl<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>
           + (ulong)(uVar4 * 8)),this_01);
    ::std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>::
    ~unique_ptr((unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>
                 *)&local_38);
    PropertyIdSet::Insert(&this->property_ids,PVar2);
    if (inherited) {
      PropertyIdSet::Insert(&this->property_ids_inherited,PVar2);
    }
    if (forces_layout) {
      PropertyIdSet::Insert(&this->property_ids_forcing_layout,PVar2);
    }
  }
  puVar6 = (pointer)((long)&(((this->properties).
                              super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                            super___uniq_ptr_impl<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>
                    + (ulong)(uVar4 << 3));
LAB_0025a59f:
  return (PropertyDefinition *)
         (_Tuple_impl<0UL,_Rml::PropertyDefinition_*,_std::default_delete<Rml::PropertyDefinition>_>
         )*(_Tuple_impl<0UL,_Rml::PropertyDefinition_*,_std::default_delete<Rml::PropertyDefinition>_>
            *)&(puVar6->_M_t).
               super___uniq_ptr_impl<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>
  ;
}

Assistant:

PropertyDefinition& PropertySpecification::RegisterProperty(const String& property_name, const String& default_value, bool inherited,
	bool forces_layout, PropertyId id)
{
	if (id == PropertyId::Invalid)
		id = property_map->GetOrCreateId(property_name);
	else
		property_map->AddPair(id, property_name);

	size_t index = (size_t)id;

	if (index >= size_t(PropertyId::MaxNumIds))
	{
		Log::Message(Log::LT_ERROR,
			"Fatal error while registering property '%s': Maximum number of allowed properties exceeded. Continuing execution may lead to crash.",
			property_name.c_str());
		RMLUI_ERROR;
		return *properties[0];
	}

	if (index < properties.size())
	{
		// We don't want to owerwrite an existing entry.
		if (properties[index])
		{
			Log::Message(Log::LT_ERROR, "While registering property '%s': The property is already registered.", property_name.c_str());
			return *properties[index];
		}
	}
	else
	{
		// Resize vector to hold the new index
		properties.resize((index * 3) / 2 + 1);
	}

	// Create and insert the new property
	properties[index] = MakeUnique<PropertyDefinition>(id, default_value, inherited, forces_layout);
	property_ids.Insert(id);
	if (inherited)
		property_ids_inherited.Insert(id);
	if (forces_layout)
		property_ids_forcing_layout.Insert(id);

	return *properties[index];
}